

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgen4.c
# Opt level: O0

void set5Clause(Clause *c,int v1,int v2,int v3,int v4,int v5)

{
  int v5_local;
  int v4_local;
  int v3_local;
  int v2_local;
  int v1_local;
  Clause *c_local;
  
  c->numOfVariables = 3;
  c->variables[0] = v1;
  c->variables[1] = v2;
  c->variables[2] = v3;
  c->variables[3] = v4;
  c->variables[4] = v5;
  return;
}

Assistant:

void set5Clause (Clause *c, int v1, int v2, int v3, int v4, int v5)
{
    c->numOfVariables = 3;
    c->variables[0] = v1;
    c->variables[1] = v2;
    c->variables[2] = v3;
    c->variables[3] = v4;
    c->variables[4] = v5;
}